

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divsufsortxx.h
# Opt level: O0

void divsufsortxx::tandemrepeat::
     introsort<std::stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>>,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long>
               (stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
                *stack,iterator ISA,iterator ISAd,iterator SA,iterator first,iterator last,
               long *budget,int *chance,long size)

{
  iterator c_00;
  iterator c_01;
  iterator c_02;
  iterator c_03;
  iterator c_04;
  iterator c_05;
  iterator c_06;
  iterator c_07;
  iterator c_08;
  iterator c_09;
  iterator c_10;
  iterator c_11;
  iterator __b;
  iterator __a;
  iterator SA_00;
  iterator last_00;
  iterator Td;
  iterator first_00;
  iterator ISAd_00;
  iterator first2;
  iterator first2_00;
  iterator first1;
  iterator first1_00;
  iterator Td_00;
  iterator Td_01;
  iterator last_01;
  iterator last_02;
  iterator b_00;
  iterator a_00;
  iterator a_01;
  iterator b_01;
  iterator a_02;
  iterator a_03;
  iterator b_02;
  iterator a_04;
  iterator b_03;
  iterator a_05;
  iterator b_04;
  iterator b_05;
  iterator a_06;
  iterator b_06;
  iterator a_07;
  iterator b_07;
  iterator b_08;
  iterator a_08;
  iterator b_09;
  iterator a_09;
  iterator b_10;
  iterator a_10;
  iterator b_11;
  iterator a_11;
  iterator b_12;
  iterator b_13;
  iterator b_14;
  iterator b_15;
  iterator b_16;
  iterator b_17;
  iterator c_12;
  iterator c_13;
  iterator c_14;
  iterator c_15;
  iterator c_16;
  iterator c_17;
  bool bVar1;
  bool bVar2;
  int iVar3;
  difference_type dVar4;
  difference_type dVar5;
  reference pvVar6;
  long lVar7;
  iterator *piVar8;
  BitmapArray<long> *in_RCX;
  BitmapArray<long> *in_RDI;
  pos_type in_R8;
  long *in_R9;
  reference rVar9;
  BitmapArray<long> *in_stack_00000018;
  pos_type in_stack_00000020;
  value_type *in_stack_00000028;
  value_reference *in_stack_00000030;
  int *in_stack_00000038;
  long in_stack_00000040;
  stackinfo_type temp_1;
  stackinfo_type tempinfo_2;
  stackinfo_type tempinfo_1;
  stackinfo_type tempinfo;
  stackinfo_type temp;
  int next;
  int limit;
  value_type x;
  value_type v;
  long t;
  long s;
  iterator e;
  iterator d;
  iterator c;
  iterator b;
  iterator a;
  value_type *in_stack_fffffffffffff058;
  value_type *pvVar10;
  value_reference *in_stack_fffffffffffff060;
  value_reference *pvVar11;
  iterator *in_stack_fffffffffffff068;
  iterator *in_stack_fffffffffffff070;
  BitmapArray<long> *in_stack_fffffffffffff078;
  pos_type in_stack_fffffffffffff080;
  undefined8 in_stack_fffffffffffff088;
  undefined7 in_stack_fffffffffffff090;
  undefined1 in_stack_fffffffffffff097;
  int local_f5c;
  int local_ebc;
  int local_e94;
  pos_type in_stack_fffffffffffff190;
  difference_type in_stack_fffffffffffff198;
  undefined7 in_stack_fffffffffffff1a0;
  undefined1 in_stack_fffffffffffff1a7;
  BitmapArray<long> *in_stack_fffffffffffff1a8;
  pos_type in_stack_fffffffffffff1b0;
  undefined7 in_stack_fffffffffffff1b8;
  undefined1 in_stack_fffffffffffff1bf;
  BitmapArray<long> *in_stack_fffffffffffff1c0;
  BitmapArray<long> *in_stack_fffffffffffff1c8;
  BitmapArray<long> *in_stack_fffffffffffff1d0;
  iterator in_stack_fffffffffffff270;
  iterator in_stack_fffffffffffff280;
  iterator in_stack_fffffffffffff290;
  undefined1 local_d60 [16];
  iterator iStack_d50;
  iterator iStack_d40;
  int in_stack_fffffffffffff2d0;
  undefined4 in_stack_fffffffffffff2d4;
  BitmapArray<long> *in_stack_fffffffffffff2d8;
  BitmapArray<long> *in_stack_fffffffffffff2e0;
  BitmapArray<long> *in_stack_fffffffffffff2e8;
  BitmapArray<long> *in_stack_fffffffffffff2f0;
  BitmapArray<long> *in_stack_fffffffffffff2f8;
  BitmapArray<long> *in_stack_fffffffffffff310;
  value_type *in_stack_fffffffffffff318;
  value_reference *in_stack_fffffffffffff320;
  value_type *in_stack_fffffffffffff328;
  value_reference *in_stack_fffffffffffff330;
  stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>
  local_cb8;
  value_type *local_c80;
  value_reference *local_c78;
  BitmapArray<long> *local_c60;
  pos_type local_c58;
  stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>
  local_c50;
  value_type *local_c18;
  value_reference *local_c10;
  value_type *local_c08;
  value_reference *local_c00;
  iterator local_bf8;
  stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>
  local_be8;
  value_type *local_bb0;
  value_reference *local_ba8;
  BitmapArray<long> *local_b90;
  pos_type local_b88;
  stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>
  local_b80;
  value_type *local_b48;
  value_reference *local_b40;
  BitmapArray<long> *local_b28;
  pos_type local_b20;
  stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>
  local_b18;
  value_type *local_ae0;
  value_reference *local_ad8;
  value_type *local_ad0;
  value_reference *local_ac8;
  iterator local_ac0;
  stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>
  local_ab0;
  value_type *local_a78;
  value_reference *local_a70;
  BitmapArray<long> *local_a58;
  pos_type local_a50;
  stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>
  local_a48;
  value_type *local_a00;
  value_reference *local_9f8;
  BitmapArray<long> *local_9f0;
  pos_type local_9e8;
  stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>
  local_9e0;
  value_type *local_9a8;
  value_reference *local_9a0;
  value_type *local_998;
  value_reference *local_990;
  iterator local_988;
  stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>
  local_978;
  value_type *local_930;
  value_reference *local_928;
  BitmapArray<long> *local_920;
  pos_type local_918;
  stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>
  local_910;
  value_type *local_8c8;
  value_reference *local_8c0;
  BitmapArray<long> *local_8b8;
  pos_type local_8b0;
  stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>
  local_8a8;
  value_type *local_870;
  value_reference *local_868;
  value_type *local_860;
  value_reference *local_858;
  iterator local_850;
  stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>
  local_840;
  reference local_808;
  reference local_7f8;
  reference local_7e8;
  reference local_7d8;
  reference local_7c8;
  reference local_7b8;
  reference local_7a8;
  reference local_798;
  reference local_788;
  reference local_778;
  undefined1 local_768 [56];
  BitmapArray<long> *local_730;
  pos_type local_728;
  value_type *local_720;
  value_reference *local_718;
  BitmapArray<long> *local_6e0;
  pos_type local_6d8;
  iterator local_6d0;
  reference local_6c0;
  reference local_6b0;
  reference local_6a0;
  reference local_690;
  reference local_680;
  reference local_670;
  iterator local_660 [2];
  BitmapArray<long> *local_640;
  pos_type local_638;
  iterator local_630;
  iterator iStack_620;
  iterator iStack_610;
  int local_600;
  BitmapArray<long> *local_5d8;
  pos_type local_5d0;
  iterator local_5c8;
  iterator iStack_5b8;
  iterator iStack_5a8;
  int local_598;
  value_type *local_590;
  value_reference *local_588;
  iterator local_570;
  stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>
  local_560;
  value_type *local_518;
  value_reference *local_510;
  BitmapArray<long> *local_508;
  pos_type local_500;
  stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>
  local_4f8;
  reference local_4c0;
  reference local_4b0;
  reference local_4a0;
  reference local_490;
  reference local_480;
  reference local_470;
  reference local_460;
  reference local_450;
  reference local_440;
  reference local_430;
  reference local_420;
  reference local_410;
  reference local_400;
  iterator local_3f0;
  iterator iStack_3e0;
  iterator iStack_3d0;
  int local_3c0;
  reference local_3b8;
  reference local_3a8;
  reference local_398;
  reference local_388;
  iterator local_378;
  iterator local_368;
  reference local_358;
  reference local_348;
  reference local_338;
  reference local_328;
  undefined1 local_318 [16];
  iterator iStack_308;
  iterator iStack_2f8;
  value_type *local_2e0;
  value_reference *local_2d8;
  BitmapArray<long> *local_2d0;
  pos_type local_2c8;
  BitmapArray<long> *local_2c0;
  pos_type local_2b8;
  stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>
  local_2b0;
  value_type *local_278;
  value_reference *local_270;
  value_type *local_268;
  value_reference *local_260;
  BitmapArray<long> *local_258;
  pos_type local_250;
  stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>
  local_248;
  iterator local_1f0;
  stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>
  local_1e0;
  value_type *local_1a8;
  value_reference *local_1a0;
  value_type *local_198;
  value_reference *local_190;
  BitmapArray<long> *local_188;
  pos_type local_180;
  stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>
  local_178;
  reference local_140;
  reference local_130;
  reference local_120;
  reference local_110;
  BitmapArray<long> local_100;
  iterator local_c8;
  int local_b8;
  int local_b4;
  long local_b0;
  long local_a8;
  difference_type local_a0;
  pos_type local_98;
  iterator local_90;
  iterator local_80;
  iterator local_70;
  iterator local_60;
  iterator local_50;
  long *local_40;
  BitmapArray<long> *local_38;
  iterator local_30;
  iterator local_20;
  
  local_40 = in_R9;
  local_38 = in_RDI;
  local_30.array_ = in_RCX;
  local_30.pos_ = in_R8;
  bitmap::BitmapArray<long>::iterator::iterator(&local_50);
  bitmap::BitmapArray<long>::iterator::iterator(&local_60);
  bitmap::BitmapArray<long>::iterator::iterator(&local_70);
  bitmap::BitmapArray<long>::iterator::iterator(&local_80);
  bitmap::BitmapArray<long>::iterator::iterator(&local_90);
  dVar4 = bitmap::BitmapArray<long>::iterator::operator-
                    ((iterator *)&stack0x00000028,(iterator *)&stack0x00000018);
  local_b4 = helper::lg<long>(dVar4);
  do {
    do {
      while( true ) {
        while( true ) {
          while( true ) {
            while (local_b4 < 0) {
              if (local_b4 == -1) {
                local_c8 = bitmap::BitmapArray<long>::iterator::operator-
                                     (in_stack_fffffffffffff068,
                                      (difference_type)in_stack_fffffffffffff060);
                local_100.super_Bitmap.data_ = (data_type *)in_stack_00000028;
                local_100.super_Bitmap.size_ = (size_type)in_stack_00000030;
                dVar4 = bitmap::BitmapArray<long>::iterator::operator-
                                  ((iterator *)&stack0x00000028,(iterator *)&stack0x00000008);
                local_100.super_Bitmap._vptr_Bitmap = (_func_int **)(dVar4 + -1);
                in_stack_fffffffffffff068 = &local_50;
                in_stack_fffffffffffff070 = &local_60;
                in_stack_fffffffffffff078 = &local_100;
                Td_00.pos_ = (pos_type)in_stack_fffffffffffff2f8;
                Td_00.array_ = in_stack_fffffffffffff2f0;
                first1.pos_ = (pos_type)in_stack_fffffffffffff2e8;
                first1.array_ = in_stack_fffffffffffff2e0;
                first2.array_._4_4_ = in_stack_fffffffffffff2d4;
                first2.array_._0_4_ = in_stack_fffffffffffff2d0;
                first2.pos_ = (pos_type)in_stack_fffffffffffff2d8;
                last_01.pos_ = (pos_type)in_stack_fffffffffffff318;
                last_01.array_ = in_stack_fffffffffffff310;
                helper::
                partition<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
                          (Td_00,first1,first2,last_01,(iterator *)in_stack_fffffffffffff320,
                           &in_stack_fffffffffffff328->m_a,(value_type *)in_stack_fffffffffffff330);
                bVar1 = bitmap::BitmapArray<long>::iterator::operator<
                                  (&local_50,(iterator *)&stack0x00000028);
                pvVar10 = (value_type *)local_100.super_Bitmap.data_;
                pvVar11 = (value_reference *)local_100.super_Bitmap.size_;
                if (bVar1) {
                  bitmap::BitmapArray<long>::iterator::operator=
                            (&local_70,(iterator *)&stack0x00000018);
                  dVar4 = bitmap::BitmapArray<long>::iterator::operator-
                                    (&local_50,(iterator *)&stack0x00000008);
                  local_a8 = dVar4 + -1;
                  pvVar10 = (value_type *)local_100.super_Bitmap.data_;
                  pvVar11 = (value_reference *)local_100.super_Bitmap.size_;
                  while (bVar1 = bitmap::BitmapArray<long>::iterator::operator<(&local_70,&local_50)
                        , bVar1) {
                    local_120 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x123641)
                    ;
                    bitmap::BitmapArray::value_reference::operator_cast_to_long
                              ((value_reference *)0x12365e);
                    local_110 = bitmap::BitmapArray<long>::iterator::operator[]
                                          (in_stack_fffffffffffff070,
                                           (difference_type)in_stack_fffffffffffff068);
                    bitmap::BitmapArray<long>::value_reference::operator=(pvVar11,(long)pvVar10);
                    bitmap::BitmapArray<long>::iterator::operator++(&local_70);
                  }
                }
                bVar1 = bitmap::BitmapArray<long>::iterator::operator<
                                  (&local_60,(iterator *)&stack0x00000028);
                if (bVar1) {
                  bitmap::BitmapArray<long>::iterator::operator=(&local_70,&local_50);
                  dVar4 = bitmap::BitmapArray<long>::iterator::operator-
                                    (&local_60,(iterator *)&stack0x00000008);
                  local_a8 = dVar4 + -1;
                  while (bVar1 = bitmap::BitmapArray<long>::iterator::operator<(&local_70,&local_60)
                        , bVar1) {
                    local_140 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x123736)
                    ;
                    bitmap::BitmapArray::value_reference::operator_cast_to_long
                              ((value_reference *)0x123753);
                    local_130 = bitmap::BitmapArray<long>::iterator::operator[]
                                          (in_stack_fffffffffffff070,
                                           (difference_type)in_stack_fffffffffffff068);
                    bitmap::BitmapArray<long>::value_reference::operator=(pvVar11,(long)pvVar10);
                    bitmap::BitmapArray<long>::iterator::operator++(&local_70);
                  }
                }
                local_188 = local_30.array_;
                local_180 = local_30.pos_;
                local_198 = (value_type *)local_50.array_;
                local_190 = (value_reference *)local_50.pos_;
                local_1a8 = (value_type *)local_60.array_;
                local_1a0 = (value_reference *)local_60.pos_;
                a_11.pos_ = local_30.pos_;
                a_11.array_ = local_30.array_;
                b_11.pos_ = local_50.pos_;
                b_11.array_ = local_50.array_;
                c_00.pos_ = local_60.pos_;
                c_00.array_ = local_60.array_;
                pvVar10 = (value_type *)local_60.array_;
                pvVar11 = (value_reference *)local_60.pos_;
                in_stack_fffffffffffff1d0 = local_38;
                helper::
                stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>
                ::stackinfo4(&local_178,a_11,b_11,c_00,0);
                std::
                stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
                ::push((stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
                        *)pvVar11,pvVar10);
                local_1f0 = bitmap::BitmapArray<long>::iterator::operator-
                                      (in_stack_fffffffffffff068,(difference_type)pvVar11);
                b_12.pos_ = in_stack_00000020;
                b_12.array_ = in_stack_00000018;
                c_12.pos_ = (pos_type)in_stack_00000030;
                c_12.array_ = (BitmapArray<long> *)in_stack_00000028;
                in_stack_fffffffffffff058 = in_stack_00000028;
                in_stack_fffffffffffff060 = in_stack_00000030;
                helper::
                stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>
                ::stackinfo4(&local_1e0,local_1f0,b_12,c_12,-2);
                std::
                stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
                ::push((stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
                        *)in_stack_fffffffffffff060,in_stack_fffffffffffff058);
                dVar4 = bitmap::BitmapArray<long>::iterator::operator-
                                  (&local_50,(iterator *)&stack0x00000018);
                dVar5 = bitmap::BitmapArray<long>::iterator::operator-
                                  ((iterator *)&stack0x00000028,&local_60);
                if (dVar5 < dVar4) {
                  bVar1 = bitmap::BitmapArray<long>::iterator::operator<
                                    (&local_60,(iterator *)&stack0x00000028);
                  if (bVar1) {
                    local_2c0 = local_30.array_;
                    local_2b8 = local_30.pos_;
                    local_2d0 = in_stack_00000018;
                    local_2c8 = in_stack_00000020;
                    local_2e0 = (value_type *)local_50.array_;
                    local_2d8 = (value_reference *)local_50.pos_;
                    in_stack_fffffffffffff1c0 = local_38;
                    dVar4 = bitmap::BitmapArray<long>::iterator::operator-
                                      (&local_50,(iterator *)&stack0x00000018);
                    iVar3 = helper::lg<long>(dVar4);
                    a_09.pos_ = local_2b8;
                    a_09.array_ = local_2c0;
                    b_09.pos_ = local_2c8;
                    b_09.array_ = local_2d0;
                    c_02.pos_ = (pos_type)local_2d8;
                    c_02.array_ = (BitmapArray<long> *)local_2e0;
                    in_stack_fffffffffffff058 = local_2e0;
                    in_stack_fffffffffffff060 = local_2d8;
                    helper::
                    stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>
                    ::stackinfo4(&local_2b0,a_09,b_09,c_02,iVar3);
                    std::
                    stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
                    ::push((stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
                            *)in_stack_fffffffffffff060,in_stack_fffffffffffff058);
                    bitmap::BitmapArray<long>::iterator::operator=
                              ((iterator *)&stack0x00000018,&local_60);
                  }
                  else {
                    bitmap::BitmapArray<long>::iterator::operator=
                              ((iterator *)&stack0x00000028,&local_50);
                  }
                }
                else {
                  bVar1 = bitmap::BitmapArray<long>::iterator::operator<
                                    ((iterator *)&stack0x00000018,&local_50);
                  if (bVar1) {
                    local_258 = local_30.array_;
                    local_250 = local_30.pos_;
                    local_268 = (value_type *)local_60.array_;
                    local_260 = (value_reference *)local_60.pos_;
                    local_278 = in_stack_00000028;
                    local_270 = in_stack_00000030;
                    in_stack_fffffffffffff1c8 = local_38;
                    dVar4 = bitmap::BitmapArray<long>::iterator::operator-
                                      ((iterator *)&stack0x00000028,&local_60);
                    iVar3 = helper::lg<long>(dVar4);
                    a_10.pos_ = local_250;
                    a_10.array_ = local_258;
                    b_10.pos_ = (pos_type)local_260;
                    b_10.array_ = (BitmapArray<long> *)local_268;
                    c_01.pos_ = (pos_type)local_270;
                    c_01.array_ = (BitmapArray<long> *)local_278;
                    helper::
                    stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>
                    ::stackinfo4(&local_248,a_10,b_10,c_01,iVar3);
                    std::
                    stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
                    ::push((stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
                            *)local_270,local_278);
                    bitmap::BitmapArray<long>::iterator::operator=
                              ((iterator *)&stack0x00000028,&local_50);
                    in_stack_fffffffffffff058 = local_278;
                    in_stack_fffffffffffff060 = local_270;
                  }
                  else {
                    bitmap::BitmapArray<long>::iterator::operator=
                              ((iterator *)&stack0x00000018,&local_60);
                  }
                }
                dVar4 = bitmap::BitmapArray<long>::iterator::operator-
                                  ((iterator *)&stack0x00000028,(iterator *)&stack0x00000018);
                local_b4 = helper::lg<long>(dVar4);
              }
              else if (local_b4 == -2) {
                pvVar6 = std::
                         stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
                         ::top((stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
                                *)0x123c23);
                memcpy(local_318,pvVar6,0x38);
                std::
                stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
                ::pop((stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
                       *)0x123c45);
                bitmap::BitmapArray<long>::iterator::operator=(&local_50,&iStack_308);
                bitmap::BitmapArray<long>::iterator::operator=(&local_60,&iStack_2f8);
                local_a0 = bitmap::BitmapArray<long>::iterator::operator-(&local_30,&local_20);
                dVar4 = bitmap::BitmapArray<long>::iterator::operator-
                                  (&local_60,(iterator *)&stack0x00000008);
                local_a8 = dVar4 + -1;
                bitmap::BitmapArray<long>::iterator::operator=
                          (&local_70,(iterator *)&stack0x00000018);
                bitmap::BitmapArray<long>::iterator::operator=(&local_80,&local_50);
                while (bVar1 = bitmap::BitmapArray<long>::iterator::operator<(&local_70,&local_80),
                      bVar1) {
                  local_328 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x123d0a);
                  lVar7 = bitmap::BitmapArray::value_reference::operator_cast_to_long
                                    ((value_reference *)0x123d27);
                  local_98 = lVar7 - local_a0;
                  in_stack_fffffffffffff1bf = false;
                  if (-1 < (long)local_98) {
                    local_338 = bitmap::BitmapArray<long>::iterator::operator[]
                                          (in_stack_fffffffffffff070,
                                           (difference_type)in_stack_fffffffffffff068);
                    lVar7 = bitmap::BitmapArray::value_reference::operator_cast_to_long
                                      ((value_reference *)0x123d7c);
                    in_stack_fffffffffffff1bf = lVar7 == local_a8;
                  }
                  if ((bool)in_stack_fffffffffffff1bf != false) {
                    in_stack_fffffffffffff1a8 =
                         (BitmapArray<long> *)
                         bitmap::BitmapArray<long>::iterator::operator-
                                   (&local_80,(iterator *)&stack0x00000008);
                    local_348 = bitmap::BitmapArray<long>::iterator::operator[]
                                          (in_stack_fffffffffffff070,
                                           (difference_type)in_stack_fffffffffffff068);
                    bitmap::BitmapArray<long>::value_reference::operator=
                              (in_stack_fffffffffffff060,(long)in_stack_fffffffffffff058);
                    in_stack_fffffffffffff1b0 = local_98;
                    local_368 = bitmap::BitmapArray<long>::iterator::operator++
                                          (&in_stack_fffffffffffff058->m_a,0);
                    local_358 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x123e31)
                    ;
                    bitmap::BitmapArray<long>::value_reference::operator=
                              (in_stack_fffffffffffff060,(long)in_stack_fffffffffffff058);
                  }
                  bitmap::BitmapArray<long>::iterator::operator++(&local_70);
                }
                local_378 = bitmap::BitmapArray<long>::iterator::operator-
                                      (in_stack_fffffffffffff068,
                                       (difference_type)in_stack_fffffffffffff060);
                bitmap::BitmapArray<long>::iterator::operator=(&local_70,&local_378);
                bitmap::BitmapArray<long>::iterator::operator=(&local_90,&local_80);
                bitmap::BitmapArray<long>::iterator::operator=(&local_80,&local_60);
                while (bVar1 = bitmap::BitmapArray<long>::iterator::operator<(&local_90,&local_80),
                      bVar1) {
                  local_388 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x123ef6);
                  lVar7 = bitmap::BitmapArray::value_reference::operator_cast_to_long
                                    ((value_reference *)0x123f13);
                  local_98 = lVar7 - local_a0;
                  in_stack_fffffffffffff1a7 = false;
                  if (-1 < (long)local_98) {
                    local_398 = bitmap::BitmapArray<long>::iterator::operator[]
                                          (in_stack_fffffffffffff070,
                                           (difference_type)in_stack_fffffffffffff068);
                    lVar7 = bitmap::BitmapArray::value_reference::operator_cast_to_long
                                      ((value_reference *)0x123f68);
                    in_stack_fffffffffffff1a7 = lVar7 == local_a8;
                  }
                  if ((bool)in_stack_fffffffffffff1a7 != false) {
                    in_stack_fffffffffffff190 = local_98;
                    bitmap::BitmapArray<long>::iterator::operator--(&local_80);
                    local_3a8 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x123faf)
                    ;
                    bitmap::BitmapArray<long>::value_reference::operator=
                              (in_stack_fffffffffffff060,(long)in_stack_fffffffffffff058);
                    in_stack_fffffffffffff198 =
                         bitmap::BitmapArray<long>::iterator::operator-
                                   (&local_80,(iterator *)&stack0x00000008);
                    local_3b8 = bitmap::BitmapArray<long>::iterator::operator[]
                                          (in_stack_fffffffffffff070,
                                           (difference_type)in_stack_fffffffffffff068);
                    bitmap::BitmapArray<long>::value_reference::operator=
                              (in_stack_fffffffffffff060,(long)in_stack_fffffffffffff058);
                  }
                  bitmap::BitmapArray<long>::iterator::operator--(&local_70);
                }
                bVar1 = std::
                        stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
                        ::empty((stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
                                 *)0x12404c);
                if (bVar1) {
                  return;
                }
                pvVar6 = std::
                         stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
                         ::top((stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
                                *)0x124064);
                memcpy(&local_3f0,pvVar6,0x38);
                bitmap::BitmapArray<long>::iterator::operator=(&local_30,&local_3f0);
                bitmap::BitmapArray<long>::iterator::operator=
                          ((iterator *)&stack0x00000018,&iStack_3e0);
                bitmap::BitmapArray<long>::iterator::operator=
                          ((iterator *)&stack0x00000028,&iStack_3d0);
                local_b4 = local_3c0;
                std::
                stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
                ::pop((stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
                       *)0x1240db);
              }
              else {
                local_400 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x1240ed);
                lVar7 = bitmap::BitmapArray::value_reference::operator_cast_to_long
                                  ((value_reference *)0x12410a);
                if (-1 < lVar7) {
                  bitmap::BitmapArray<long>::iterator::operator=
                            (&local_50,(iterator *)&stack0x00000018);
                  do {
                    bitmap::BitmapArray<long>::iterator::operator-
                              (&local_50,(iterator *)&stack0x00000008);
                    local_420 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x124157)
                    ;
                    bitmap::BitmapArray::value_reference::operator_cast_to_long
                              ((value_reference *)0x124174);
                    local_410 = bitmap::BitmapArray<long>::iterator::operator[]
                                          (in_stack_fffffffffffff070,
                                           (difference_type)in_stack_fffffffffffff068);
                    bitmap::BitmapArray<long>::value_reference::operator=
                              (in_stack_fffffffffffff060,(long)in_stack_fffffffffffff058);
                    piVar8 = bitmap::BitmapArray<long>::iterator::operator++(&local_50);
                    bVar2 = bitmap::BitmapArray<long>::iterator::operator<
                                      (piVar8,(iterator *)&stack0x00000028);
                    bVar1 = false;
                    if (bVar2) {
                      local_430 = bitmap::BitmapArray<long>::iterator::operator*
                                            ((iterator *)0x1241e5);
                      lVar7 = bitmap::BitmapArray::value_reference::operator_cast_to_long
                                        ((value_reference *)0x124202);
                      bVar1 = -1 < lVar7;
                    }
                  } while (bVar1);
                  bitmap::BitmapArray<long>::iterator::operator=
                            ((iterator *)&stack0x00000018,&local_50);
                }
                bVar1 = bitmap::BitmapArray<long>::iterator::operator<
                                  ((iterator *)&stack0x00000018,(iterator *)&stack0x00000028);
                if (bVar1) {
                  bitmap::BitmapArray<long>::iterator::operator=
                            (&local_50,(iterator *)&stack0x00000018);
                  do {
                    local_440 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x124278)
                    ;
                    bitmap::BitmapArray::value_reference::operator_cast_to_long
                              ((value_reference *)0x124295);
                    local_450 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x1242ae)
                    ;
                    bitmap::BitmapArray<long>::value_reference::operator=
                              (in_stack_fffffffffffff060,(long)in_stack_fffffffffffff058);
                    bitmap::BitmapArray<long>::iterator::operator++(&local_50);
                    local_460 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x1242e8)
                    ;
                    lVar7 = bitmap::BitmapArray::value_reference::operator_cast_to_long
                                      ((value_reference *)0x124305);
                  } while (lVar7 < 0);
                  bitmap::BitmapArray<long>::iterator::operator++(&local_50);
                  bVar1 = bitmap::BitmapArray<long>::iterator::operator<
                                    (&local_50,(iterator *)&stack0x00000028);
                  if (bVar1) {
                    bitmap::BitmapArray<long>::iterator::operator=
                              (&local_70,(iterator *)&stack0x00000018);
                    dVar4 = bitmap::BitmapArray<long>::iterator::operator-
                                      (&local_50,(iterator *)&stack0x00000008);
                    local_a8 = dVar4 + -1;
                    while (bVar1 = bitmap::BitmapArray<long>::iterator::operator<
                                             (&local_70,&local_50), bVar1) {
                      local_480 = bitmap::BitmapArray<long>::iterator::operator*
                                            ((iterator *)0x1243ab);
                      bitmap::BitmapArray::value_reference::operator_cast_to_long
                                ((value_reference *)0x1243c8);
                      local_470 = bitmap::BitmapArray<long>::iterator::operator[]
                                            (in_stack_fffffffffffff070,
                                             (difference_type)in_stack_fffffffffffff068);
                      bitmap::BitmapArray<long>::value_reference::operator=
                                (in_stack_fffffffffffff060,(long)in_stack_fffffffffffff058);
                      bitmap::BitmapArray<long>::iterator::operator++(&local_70);
                    }
                  }
                  local_4a0 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x12441e);
                  bitmap::BitmapArray::value_reference::operator_cast_to_long
                            ((value_reference *)0x12443b);
                  local_490 = bitmap::BitmapArray<long>::iterator::operator[]
                                        (in_stack_fffffffffffff070,
                                         (difference_type)in_stack_fffffffffffff068);
                  local_4c0 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x124468);
                  bitmap::BitmapArray::value_reference::operator_cast_to_long
                            ((value_reference *)0x124485);
                  local_4b0 = bitmap::BitmapArray<long>::iterator::operator[]
                                        (in_stack_fffffffffffff070,
                                         (difference_type)in_stack_fffffffffffff068);
                  bVar1 = bitmap::BitmapArray<long>::value_reference::operator==
                                    (in_stack_fffffffffffff060,
                                     (value_reference *)in_stack_fffffffffffff058);
                  if (bVar1) {
                    local_e94 = -1;
                  }
                  else {
                    dVar4 = bitmap::BitmapArray<long>::iterator::operator-
                                      (&local_50,(iterator *)&stack0x00000018);
                    local_e94 = helper::lg<long>(dVar4);
                  }
                  local_b8 = local_e94;
                  dVar4 = bitmap::BitmapArray<long>::iterator::operator-
                                    ((iterator *)&stack0x00000028,(iterator *)&stack0x00000018);
                  *local_40 = *local_40 - dVar4;
                  if (*local_40 < 1) {
                    *local_40 = in_stack_00000040 + *local_40;
                    iVar3 = *in_stack_00000038;
                    *in_stack_00000038 = iVar3 + -1;
                    if (iVar3 + -1 == 0) goto LAB_00125fc5;
                  }
                  dVar4 = bitmap::BitmapArray<long>::iterator::operator-
                                    (&local_50,(iterator *)&stack0x00000018);
                  dVar5 = bitmap::BitmapArray<long>::iterator::operator-
                                    ((iterator *)&stack0x00000028,&local_50);
                  if (dVar5 < dVar4) {
                    bVar1 = bitmap::BitmapArray<long>::iterator::operator<
                                      (&local_50,(iterator *)&stack0x00000028);
                    if (bVar1) {
                      local_570 = bitmap::BitmapArray<long>::iterator::operator+
                                            (in_stack_fffffffffffff068,
                                             (difference_type)in_stack_fffffffffffff060);
                      b_13.pos_ = in_stack_00000020;
                      b_13.array_ = in_stack_00000018;
                      local_590 = (value_type *)local_50.array_;
                      local_588 = (value_reference *)local_50.pos_;
                      c_03.pos_ = local_50.pos_;
                      c_03.array_ = local_50.array_;
                      in_stack_fffffffffffff058 = (value_type *)local_50.array_;
                      in_stack_fffffffffffff060 = (value_reference *)local_50.pos_;
                      helper::
                      stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>
                      ::stackinfo4(&local_560,local_570,b_13,c_03,local_b8);
                      std::
                      stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
                      ::push((stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
                              *)in_stack_fffffffffffff060,in_stack_fffffffffffff058);
                      bitmap::BitmapArray<long>::iterator::operator=
                                ((iterator *)&stack0x00000018,&local_50);
                      local_b4 = -3;
                    }
                    else {
                      bitmap::BitmapArray<long>::iterator::operator+=(&local_30,1);
                      bitmap::BitmapArray<long>::iterator::operator=
                                ((iterator *)&stack0x00000028,&local_50);
                      local_b4 = local_b8;
                    }
                  }
                  else {
                    bVar1 = bitmap::BitmapArray<long>::iterator::operator<
                                      ((iterator *)&stack0x00000018,&local_50);
                    if (bVar1) {
                      local_508 = local_30.array_;
                      local_500 = local_30.pos_;
                      local_518 = (value_type *)local_50.array_;
                      local_510 = (value_reference *)local_50.pos_;
                      c_13.pos_ = (pos_type)in_stack_00000030;
                      c_13.array_ = (BitmapArray<long> *)in_stack_00000028;
                      a_08.pos_ = local_30.pos_;
                      a_08.array_ = local_30.array_;
                      b_08.pos_ = local_50.pos_;
                      b_08.array_ = local_50.array_;
                      in_stack_fffffffffffff058 = in_stack_00000028;
                      in_stack_fffffffffffff060 = in_stack_00000030;
                      helper::
                      stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>
                      ::stackinfo4(&local_4f8,a_08,b_08,c_13,-3);
                      std::
                      stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
                      ::push((stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
                              *)in_stack_fffffffffffff060,in_stack_fffffffffffff058);
                      bitmap::BitmapArray<long>::iterator::operator+=(&local_30,1);
                      bitmap::BitmapArray<long>::iterator::operator=
                                ((iterator *)&stack0x00000028,&local_50);
                      local_b4 = local_b8;
                    }
                    else {
                      bitmap::BitmapArray<long>::iterator::operator=
                                ((iterator *)&stack0x00000018,&local_50);
                      local_b4 = -3;
                    }
                  }
                }
                else {
                  bVar1 = std::
                          stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
                          ::empty((stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
                                   *)0x124856);
                  if (bVar1) {
                    return;
                  }
                  pvVar6 = std::
                           stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
                           ::top((stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
                                  *)0x12486e);
                  memcpy(&local_5c8,pvVar6,0x38);
                  bitmap::BitmapArray<long>::iterator::operator=(&local_30,&local_5c8);
                  bitmap::BitmapArray<long>::iterator::operator=
                            ((iterator *)&stack0x00000018,&iStack_5b8);
                  bitmap::BitmapArray<long>::iterator::operator=
                            ((iterator *)&stack0x00000028,&iStack_5a8);
                  local_b4 = local_598;
                  std::
                  stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
                  ::pop((stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
                         *)0x1248e5);
                }
              }
            }
            dVar4 = bitmap::BitmapArray<long>::iterator::operator-
                              ((iterator *)&stack0x00000028,(iterator *)&stack0x00000018);
            if (8 < dVar4) break;
            dVar4 = bitmap::BitmapArray<long>::iterator::operator-
                              ((iterator *)&stack0x00000028,(iterator *)&stack0x00000018);
            if (dVar4 < 2) {
              bVar1 = std::
                      stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
                      ::empty((stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
                               *)0x1249e3);
              if (bVar1) {
                return;
              }
              pvVar6 = std::
                       stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
                       ::top((stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
                              *)0x1249fb);
              memcpy(&local_630,pvVar6,0x38);
              bitmap::BitmapArray<long>::iterator::operator=(&local_30,&local_630);
              bitmap::BitmapArray<long>::iterator::operator=
                        ((iterator *)&stack0x00000018,&iStack_620);
              bitmap::BitmapArray<long>::iterator::operator=
                        ((iterator *)&stack0x00000028,&iStack_610);
              local_b4 = local_600;
              std::
              stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
              ::pop((stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
                     *)0x124a72);
            }
            else {
              local_5d8 = local_30.array_;
              local_5d0 = local_30.pos_;
              ISAd_00.pos_ = (pos_type)in_stack_fffffffffffff1d0;
              ISAd_00.array_ = in_stack_fffffffffffff1c8;
              first_00.array_._7_1_ = in_stack_fffffffffffff1bf;
              first_00.array_._0_7_ = in_stack_fffffffffffff1b8;
              first_00.pos_ = (pos_type)in_stack_fffffffffffff1c0;
              last_00.pos_ = in_stack_fffffffffffff1b0;
              last_00.array_ = in_stack_fffffffffffff1a8;
              helper::
              insertionsort<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
                        (ISAd_00,first_00,last_00);
              local_b4 = -3;
            }
          }
          if (local_b4 != 0) break;
          local_640 = local_30.array_;
          local_638 = local_30.pos_;
          local_b4 = local_b4 + -1;
          bitmap::BitmapArray<long>::iterator::operator-
                    ((iterator *)&stack0x00000028,(iterator *)&stack0x00000018);
          Td.pos_ = in_stack_fffffffffffff1b0;
          Td.array_ = in_stack_fffffffffffff1a8;
          SA_00.pos_._0_7_ = in_stack_fffffffffffff1a0;
          SA_00.array_ = (BitmapArray<long> *)in_stack_fffffffffffff198;
          SA_00.pos_._7_1_ = in_stack_fffffffffffff1a7;
          helper::heapsort<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
                    (Td,SA_00,in_stack_fffffffffffff190);
          local_660[0] = bitmap::BitmapArray<long>::iterator::operator-
                                   (in_stack_fffffffffffff068,
                                    (difference_type)in_stack_fffffffffffff060);
          bitmap::BitmapArray<long>::iterator::operator=(&local_50,local_660);
          local_680 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x124b4b);
          bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x124b68);
          local_670 = bitmap::BitmapArray<long>::iterator::operator[]
                                (in_stack_fffffffffffff070,
                                 (difference_type)in_stack_fffffffffffff068);
          lVar7 = bitmap::BitmapArray::value_reference::operator_cast_to_long
                            ((value_reference *)0x124b95);
          while (local_a8 = lVar7,
                bVar1 = bitmap::BitmapArray<long>::iterator::operator<
                                  ((iterator *)&stack0x00000018,&local_50), bVar1) {
            bitmap::BitmapArray<long>::iterator::operator--(&local_50);
            local_6a0 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x124bd0);
            bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x124bed)
            ;
            local_690 = bitmap::BitmapArray<long>::iterator::operator[]
                                  (in_stack_fffffffffffff070,
                                   (difference_type)in_stack_fffffffffffff068);
            local_b0 = bitmap::BitmapArray::value_reference::operator_cast_to_long
                                 ((value_reference *)0x124c1a);
            lVar7 = local_b0;
            if (local_b0 == local_a8) {
              local_6b0 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x124c39);
              bitmap::BitmapArray::value_reference::operator_cast_to_long
                        ((value_reference *)0x124c56);
              local_6c0 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x124c6f);
              bitmap::BitmapArray<long>::value_reference::operator=
                        (in_stack_fffffffffffff060,(long)in_stack_fffffffffffff058);
              lVar7 = local_a8;
            }
          }
          local_b4 = -3;
        }
        local_6e0 = local_30.array_;
        local_6d8 = local_30.pos_;
        local_b4 = local_b4 + -1;
        local_6d0 = helper::
                    pivot<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
                              (in_stack_fffffffffffff290,in_stack_fffffffffffff280,
                               in_stack_fffffffffffff270);
        bitmap::BitmapArray<long>::iterator::operator=(&local_50,&local_6d0);
        local_720 = (value_type *)local_50.array_;
        local_718 = (value_reference *)local_50.pos_;
        __a.pos_._0_7_ = in_stack_fffffffffffff090;
        __a.array_ = (BitmapArray<long> *)in_stack_fffffffffffff088;
        __a.pos_._7_1_ = in_stack_fffffffffffff097;
        __b.pos_ = in_stack_fffffffffffff080;
        __b.array_ = in_stack_fffffffffffff078;
        std::iter_swap<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
                  (__a,__b);
        local_730 = local_30.array_;
        local_728 = local_30.pos_;
        local_768._24_16_ =
             (undefined1  [16])
             bitmap::BitmapArray<long>::iterator::operator+
                       (in_stack_fffffffffffff068,(difference_type)in_stack_fffffffffffff060);
        local_768._8_8_ = in_stack_00000028;
        local_768._16_8_ = in_stack_00000030;
        local_788 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x124e5f);
        bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x124e7c);
        local_778 = bitmap::BitmapArray<long>::iterator::operator[]
                              (in_stack_fffffffffffff070,(difference_type)in_stack_fffffffffffff068)
        ;
        local_768._0_8_ =
             bitmap::BitmapArray::value_reference::operator_cast_to_long
                       ((value_reference *)0x124ea9);
        in_stack_fffffffffffff068 = &local_50;
        in_stack_fffffffffffff070 = &local_60;
        in_stack_fffffffffffff078 = (BitmapArray<long> *)local_768;
        Td_01.pos_ = (pos_type)in_stack_fffffffffffff2f8;
        Td_01.array_ = in_stack_fffffffffffff2f0;
        first1_00.pos_ = (pos_type)in_stack_fffffffffffff2e8;
        first1_00.array_ = in_stack_fffffffffffff2e0;
        first2_00.array_._4_4_ = in_stack_fffffffffffff2d4;
        first2_00.array_._0_4_ = in_stack_fffffffffffff2d0;
        first2_00.pos_ = (pos_type)in_stack_fffffffffffff2d8;
        last_02.pos_ = (pos_type)in_stack_fffffffffffff318;
        last_02.array_ = in_stack_fffffffffffff310;
        bVar1 = helper::
                partition<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
                          (Td_01,first1_00,first2_00,last_02,(iterator *)in_stack_fffffffffffff320,
                           &in_stack_fffffffffffff328->m_a,(value_type *)in_stack_fffffffffffff330);
        if (!bVar1) break;
        local_7a8 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x124f40);
        bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x124f5d);
        local_798 = bitmap::BitmapArray<long>::iterator::operator[]
                              (in_stack_fffffffffffff070,(difference_type)in_stack_fffffffffffff068)
        ;
        local_7c8 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x124f8a);
        bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x124fa7);
        local_7b8 = bitmap::BitmapArray<long>::iterator::operator[]
                              (in_stack_fffffffffffff070,(difference_type)in_stack_fffffffffffff068)
        ;
        bVar1 = bitmap::BitmapArray<long>::value_reference::operator==
                          ((value_reference *)local_768._16_8_,(value_reference *)local_768._8_8_);
        if (bVar1) {
          local_ebc = -1;
          in_stack_fffffffffffff058 = (value_type *)local_768._8_8_;
          in_stack_fffffffffffff060 = (value_reference *)local_768._16_8_;
        }
        else {
          dVar4 = bitmap::BitmapArray<long>::iterator::operator-(&local_60,&local_50);
          local_ebc = helper::lg<long>(dVar4);
          in_stack_fffffffffffff058 = (value_type *)local_768._8_8_;
          in_stack_fffffffffffff060 = (value_reference *)local_768._16_8_;
        }
        local_b8 = local_ebc;
        bitmap::BitmapArray<long>::iterator::operator=(&local_70,(iterator *)&stack0x00000018);
        dVar4 = bitmap::BitmapArray<long>::iterator::operator-
                          (&local_50,(iterator *)&stack0x00000008);
        local_a8 = dVar4 + -1;
        while (bVar1 = bitmap::BitmapArray<long>::iterator::operator<(&local_70,&local_50), bVar1) {
          local_7e8 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x125093);
          bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x1250b0);
          local_7d8 = bitmap::BitmapArray<long>::iterator::operator[]
                                (in_stack_fffffffffffff070,
                                 (difference_type)in_stack_fffffffffffff068);
          bitmap::BitmapArray<long>::value_reference::operator=
                    (in_stack_fffffffffffff060,(long)in_stack_fffffffffffff058);
          bitmap::BitmapArray<long>::iterator::operator++(&local_70);
        }
        bVar1 = bitmap::BitmapArray<long>::iterator::operator<
                          (&local_60,(iterator *)&stack0x00000028);
        if (bVar1) {
          bitmap::BitmapArray<long>::iterator::operator=(&local_70,&local_50);
          dVar4 = bitmap::BitmapArray<long>::iterator::operator-
                            (&local_60,(iterator *)&stack0x00000008);
          local_a8 = dVar4 + -1;
          while (bVar1 = bitmap::BitmapArray<long>::iterator::operator<(&local_70,&local_60), bVar1)
          {
            local_808 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x125186);
            bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x1251a3)
            ;
            local_7f8 = bitmap::BitmapArray<long>::iterator::operator[]
                                  (in_stack_fffffffffffff070,
                                   (difference_type)in_stack_fffffffffffff068);
            bitmap::BitmapArray<long>::value_reference::operator=
                      (in_stack_fffffffffffff060,(long)in_stack_fffffffffffff058);
            bitmap::BitmapArray<long>::iterator::operator++(&local_70);
          }
        }
        dVar4 = bitmap::BitmapArray<long>::iterator::operator-
                          ((iterator *)&stack0x00000028,(iterator *)&stack0x00000018);
        *local_40 = *local_40 - dVar4;
        if (*local_40 < 1) {
          *local_40 = in_stack_00000040 + *local_40;
          iVar3 = *in_stack_00000038;
          *in_stack_00000038 = iVar3 + -1;
          if (iVar3 + -1 == 0) goto LAB_00125fc5;
        }
        dVar4 = bitmap::BitmapArray<long>::iterator::operator-
                          (&local_50,(iterator *)&stack0x00000018);
        dVar5 = bitmap::BitmapArray<long>::iterator::operator-
                          ((iterator *)&stack0x00000028,&local_60);
        if (dVar5 < dVar4) {
          dVar4 = bitmap::BitmapArray<long>::iterator::operator-
                            (&local_50,(iterator *)&stack0x00000018);
          dVar5 = bitmap::BitmapArray<long>::iterator::operator-(&local_60,&local_50);
          if (dVar5 < dVar4) {
            dVar4 = bitmap::BitmapArray<long>::iterator::operator-
                              ((iterator *)&stack0x00000028,&local_60);
            dVar5 = bitmap::BitmapArray<long>::iterator::operator-(&local_60,&local_50);
            if (dVar5 < dVar4) {
              local_c60 = local_30.array_;
              local_c58 = local_30.pos_;
              b_17.pos_ = in_stack_00000020;
              b_17.array_ = in_stack_00000018;
              local_c80 = (value_type *)local_50.array_;
              local_c78 = (value_reference *)local_50.pos_;
              a_01.pos_ = local_30.pos_;
              a_01.array_ = local_30.array_;
              c_11.pos_ = local_50.pos_;
              c_11.array_ = local_50.array_;
              pvVar10 = (value_type *)local_50.array_;
              pvVar11 = (value_reference *)local_50.pos_;
              helper::
              stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>
              ::stackinfo4(&local_c50,a_01,b_17,c_11,local_b4);
              std::
              stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
              ::push((stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
                      *)pvVar11,pvVar10);
              c_17.pos_ = (pos_type)in_stack_00000030;
              c_17.array_ = (BitmapArray<long> *)in_stack_00000028;
              a_00.pos_ = local_30.pos_;
              a_00.array_ = local_30.array_;
              b_00.pos_ = local_60.pos_;
              b_00.array_ = local_60.array_;
              in_stack_fffffffffffff058 = in_stack_00000028;
              in_stack_fffffffffffff060 = in_stack_00000030;
              in_stack_fffffffffffff318 = in_stack_00000028;
              in_stack_fffffffffffff320 = in_stack_00000030;
              in_stack_fffffffffffff328 = (value_type *)local_60.array_;
              in_stack_fffffffffffff330 = (value_reference *)local_60.pos_;
              helper::
              stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>
              ::stackinfo4(&local_cb8,a_00,b_00,c_17,local_b4);
              std::
              stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
              ::push((stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
                      *)in_stack_fffffffffffff060,in_stack_fffffffffffff058);
              bitmap::BitmapArray<long>::iterator::operator+=(&local_30,1);
              bitmap::BitmapArray<long>::iterator::operator=((iterator *)&stack0x00000018,&local_50)
              ;
              bitmap::BitmapArray<long>::iterator::operator=((iterator *)&stack0x00000028,&local_60)
              ;
              local_b4 = local_b8;
            }
            else {
              local_b90 = local_30.array_;
              local_b88 = local_30.pos_;
              b_16.pos_ = in_stack_00000020;
              b_16.array_ = in_stack_00000018;
              local_bb0 = (value_type *)local_50.array_;
              local_ba8 = (value_reference *)local_50.pos_;
              a_02.pos_ = local_30.pos_;
              a_02.array_ = local_30.array_;
              c_09.pos_ = local_50.pos_;
              c_09.array_ = local_50.array_;
              pvVar10 = (value_type *)local_50.array_;
              pvVar11 = (value_reference *)local_50.pos_;
              helper::
              stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>
              ::stackinfo4(&local_b80,a_02,b_16,c_09,local_b4);
              std::
              stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
              ::push((stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
                      *)pvVar11,pvVar10);
              local_bf8 = bitmap::BitmapArray<long>::iterator::operator+
                                    (in_stack_fffffffffffff068,(difference_type)pvVar11);
              local_c08 = (value_type *)local_50.array_;
              local_c00 = (value_reference *)local_50.pos_;
              local_c18 = (value_type *)local_60.array_;
              local_c10 = (value_reference *)local_60.pos_;
              b_01.pos_ = local_50.pos_;
              b_01.array_ = local_50.array_;
              c_10.pos_ = local_60.pos_;
              c_10.array_ = local_60.array_;
              in_stack_fffffffffffff058 = (value_type *)local_60.array_;
              in_stack_fffffffffffff060 = (value_reference *)local_60.pos_;
              helper::
              stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>
              ::stackinfo4(&local_be8,local_bf8,b_01,c_10,local_b8);
              std::
              stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
              ::push((stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
                      *)in_stack_fffffffffffff060,in_stack_fffffffffffff058);
              bitmap::BitmapArray<long>::iterator::operator=((iterator *)&stack0x00000018,&local_60)
              ;
            }
          }
          else {
            local_ac0 = bitmap::BitmapArray<long>::iterator::operator+
                                  (in_stack_fffffffffffff068,
                                   (difference_type)in_stack_fffffffffffff060);
            local_ad0 = (value_type *)local_50.array_;
            local_ac8 = (value_reference *)local_50.pos_;
            local_ae0 = (value_type *)local_60.array_;
            local_ad8 = (value_reference *)local_60.pos_;
            b_02.pos_ = local_50.pos_;
            b_02.array_ = local_50.array_;
            c_07.pos_ = local_60.pos_;
            c_07.array_ = local_60.array_;
            pvVar10 = (value_type *)local_60.array_;
            pvVar11 = (value_reference *)local_60.pos_;
            helper::
            stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>
            ::stackinfo4(&local_ab0,local_ac0,b_02,c_07,local_b8);
            std::
            stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
            ::push((stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
                    *)pvVar11,pvVar10);
            local_b28 = local_30.array_;
            local_b20 = local_30.pos_;
            b_15.pos_ = in_stack_00000020;
            b_15.array_ = in_stack_00000018;
            local_b48 = (value_type *)local_50.array_;
            local_b40 = (value_reference *)local_50.pos_;
            a_03.pos_ = local_30.pos_;
            a_03.array_ = local_30.array_;
            c_08.pos_ = local_50.pos_;
            c_08.array_ = local_50.array_;
            in_stack_fffffffffffff058 = (value_type *)local_50.array_;
            in_stack_fffffffffffff060 = (value_reference *)local_50.pos_;
            helper::
            stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>
            ::stackinfo4(&local_b18,a_03,b_15,c_08,local_b4);
            std::
            stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
            ::push((stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
                    *)in_stack_fffffffffffff060,in_stack_fffffffffffff058);
            bitmap::BitmapArray<long>::iterator::operator=((iterator *)&stack0x00000018,&local_60);
          }
        }
        else {
          dVar4 = bitmap::BitmapArray<long>::iterator::operator-
                            ((iterator *)&stack0x00000028,&local_60);
          dVar5 = bitmap::BitmapArray<long>::iterator::operator-(&local_60,&local_50);
          if (dVar5 < dVar4) {
            dVar4 = bitmap::BitmapArray<long>::iterator::operator-
                              (&local_50,(iterator *)&stack0x00000018);
            dVar5 = bitmap::BitmapArray<long>::iterator::operator-(&local_60,&local_50);
            if (dVar5 < dVar4) {
              local_9f0 = local_30.array_;
              local_9e8 = local_30.pos_;
              local_a00 = (value_type *)local_60.array_;
              local_9f8 = (value_reference *)local_60.pos_;
              c_16.pos_ = (pos_type)in_stack_00000030;
              c_16.array_ = (BitmapArray<long> *)in_stack_00000028;
              a_05.pos_ = local_30.pos_;
              a_05.array_ = local_30.array_;
              b_03.pos_ = local_60.pos_;
              b_03.array_ = local_60.array_;
              pvVar10 = in_stack_00000028;
              pvVar11 = in_stack_00000030;
              helper::
              stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>
              ::stackinfo4(&local_9e0,a_05,b_03,c_16,local_b4);
              std::
              stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
              ::push((stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
                      *)pvVar11,pvVar10);
              local_a58 = local_30.array_;
              local_a50 = local_30.pos_;
              b_14.pos_ = in_stack_00000020;
              b_14.array_ = in_stack_00000018;
              local_a78 = (value_type *)local_50.array_;
              local_a70 = (value_reference *)local_50.pos_;
              a_04.pos_ = local_30.pos_;
              a_04.array_ = local_30.array_;
              c_06.pos_ = local_50.pos_;
              c_06.array_ = local_50.array_;
              in_stack_fffffffffffff058 = (value_type *)local_50.array_;
              in_stack_fffffffffffff060 = (value_reference *)local_50.pos_;
              helper::
              stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>
              ::stackinfo4(&local_a48,a_04,b_14,c_06,local_b4);
              std::
              stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
              ::push((stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
                      *)in_stack_fffffffffffff060,in_stack_fffffffffffff058);
              bitmap::BitmapArray<long>::iterator::operator+=(&local_30,1);
              bitmap::BitmapArray<long>::iterator::operator=((iterator *)&stack0x00000018,&local_50)
              ;
              bitmap::BitmapArray<long>::iterator::operator=((iterator *)&stack0x00000028,&local_60)
              ;
              local_b4 = local_b8;
            }
            else {
              local_920 = local_30.array_;
              local_918 = local_30.pos_;
              local_930 = (value_type *)local_60.array_;
              local_928 = (value_reference *)local_60.pos_;
              c_15.pos_ = (pos_type)in_stack_00000030;
              c_15.array_ = (BitmapArray<long> *)in_stack_00000028;
              a_06.pos_ = local_30.pos_;
              a_06.array_ = local_30.array_;
              b_05.pos_ = local_60.pos_;
              b_05.array_ = local_60.array_;
              pvVar10 = in_stack_00000028;
              pvVar11 = in_stack_00000030;
              helper::
              stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>
              ::stackinfo4(&local_910,a_06,b_05,c_15,local_b4);
              std::
              stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
              ::push((stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
                      *)pvVar11,pvVar10);
              local_988 = bitmap::BitmapArray<long>::iterator::operator+
                                    (in_stack_fffffffffffff068,(difference_type)pvVar11);
              local_998 = (value_type *)local_50.array_;
              local_990 = (value_reference *)local_50.pos_;
              local_9a8 = (value_type *)local_60.array_;
              local_9a0 = (value_reference *)local_60.pos_;
              b_04.pos_ = local_50.pos_;
              b_04.array_ = local_50.array_;
              c_05.pos_ = local_60.pos_;
              c_05.array_ = local_60.array_;
              in_stack_fffffffffffff058 = (value_type *)local_60.array_;
              in_stack_fffffffffffff060 = (value_reference *)local_60.pos_;
              helper::
              stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>
              ::stackinfo4(&local_978,local_988,b_04,c_05,local_b8);
              std::
              stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
              ::push((stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
                      *)in_stack_fffffffffffff060,in_stack_fffffffffffff058);
              bitmap::BitmapArray<long>::iterator::operator=((iterator *)&stack0x00000028,&local_50)
              ;
            }
          }
          else {
            local_850 = bitmap::BitmapArray<long>::iterator::operator+
                                  (in_stack_fffffffffffff068,
                                   (difference_type)in_stack_fffffffffffff060);
            local_860 = (value_type *)local_50.array_;
            local_858 = (value_reference *)local_50.pos_;
            local_870 = (value_type *)local_60.array_;
            local_868 = (value_reference *)local_60.pos_;
            b_07.pos_ = local_50.pos_;
            b_07.array_ = local_50.array_;
            c_04.pos_ = local_60.pos_;
            c_04.array_ = local_60.array_;
            pvVar10 = (value_type *)local_60.array_;
            pvVar11 = (value_reference *)local_60.pos_;
            helper::
            stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>
            ::stackinfo4(&local_840,local_850,b_07,c_04,local_b8);
            std::
            stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
            ::push((stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
                    *)pvVar11,pvVar10);
            local_8b8 = local_30.array_;
            local_8b0 = local_30.pos_;
            local_8c8 = (value_type *)local_60.array_;
            local_8c0 = (value_reference *)local_60.pos_;
            c_14.pos_ = (pos_type)in_stack_00000030;
            c_14.array_ = (BitmapArray<long> *)in_stack_00000028;
            a_07.pos_ = local_30.pos_;
            a_07.array_ = local_30.array_;
            b_06.pos_ = local_60.pos_;
            b_06.array_ = local_60.array_;
            in_stack_fffffffffffff058 = in_stack_00000028;
            in_stack_fffffffffffff060 = in_stack_00000030;
            helper::
            stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>
            ::stackinfo4(&local_8a8,a_07,b_06,c_14,local_b4);
            std::
            stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
            ::push((stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
                    *)in_stack_fffffffffffff060,in_stack_fffffffffffff058);
            bitmap::BitmapArray<long>::iterator::operator=((iterator *)&stack0x00000028,&local_50);
          }
        }
      }
      rVar9 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x125e7f);
      in_stack_fffffffffffff2f8 = rVar9.array_;
      bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x125e9c);
      rVar9 = bitmap::BitmapArray<long>::iterator::operator[]
                        (in_stack_fffffffffffff070,(difference_type)in_stack_fffffffffffff068);
      in_stack_fffffffffffff310 = (BitmapArray<long> *)rVar9.pos_;
      rVar9 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x125ec9);
      in_stack_fffffffffffff2d8 = rVar9.array_;
      in_stack_fffffffffffff2e0 = (BitmapArray<long> *)rVar9.pos_;
      bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x125ee6);
      rVar9 = bitmap::BitmapArray<long>::iterator::operator[]
                        (in_stack_fffffffffffff070,(difference_type)in_stack_fffffffffffff068);
      in_stack_fffffffffffff2e8 = rVar9.array_;
      in_stack_fffffffffffff2f0 = (BitmapArray<long> *)rVar9.pos_;
      bVar1 = bitmap::BitmapArray<long>::value_reference::operator==
                        ((value_reference *)local_768._16_8_,(value_reference *)local_768._8_8_);
      if (bVar1) {
        local_f5c = -1;
      }
      else {
        local_f5c = local_b4 + 1;
      }
      local_b4 = local_f5c;
      bitmap::BitmapArray<long>::iterator::operator+=(&local_30,1);
      dVar4 = bitmap::BitmapArray<long>::iterator::operator-
                        ((iterator *)&stack0x00000028,(iterator *)&stack0x00000018);
      *local_40 = *local_40 - dVar4;
      in_stack_fffffffffffff058 = (value_type *)local_768._8_8_;
      in_stack_fffffffffffff060 = (value_reference *)local_768._16_8_;
    } while (0 < *local_40);
    *local_40 = in_stack_00000040 + *local_40;
    iVar3 = *in_stack_00000038;
    *in_stack_00000038 = iVar3 + -1;
  } while (iVar3 + -1 != 0);
LAB_00125fc5:
  do {
    bVar1 = std::
            stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
            ::empty((stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
                     *)0x125fd2);
    if (bVar1) {
      return;
    }
    pvVar6 = std::
             stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
             ::top((stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
                    *)0x125fed);
    memcpy(local_d60,pvVar6,0x38);
    if (in_stack_fffffffffffff2d0 == -3) {
      bitmap::BitmapArray<long>::iterator::operator=((iterator *)&stack0x00000018,&iStack_d50);
      bitmap::BitmapArray<long>::iterator::operator=((iterator *)&stack0x00000028,&iStack_d40);
      bitmap::BitmapArray<long>::iterator::operator=(&local_50,(iterator *)&stack0x00000018);
      while (bVar1 = bitmap::BitmapArray<long>::iterator::operator<
                               (&local_50,(iterator *)&stack0x00000028), bVar1) {
        bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x126082);
        lVar7 = bitmap::BitmapArray::value_reference::operator_cast_to_long
                          ((value_reference *)0x12609f);
        if (-1 < lVar7) {
          bitmap::BitmapArray<long>::iterator::operator=(&local_60,&local_50);
          do {
            bitmap::BitmapArray<long>::iterator::operator-(&local_50,(iterator *)&stack0x00000008);
            bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x1260e9);
            bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x126106)
            ;
            bitmap::BitmapArray<long>::iterator::operator[]
                      (in_stack_fffffffffffff070,(difference_type)in_stack_fffffffffffff068);
            bitmap::BitmapArray<long>::value_reference::operator=
                      (in_stack_fffffffffffff060,(long)in_stack_fffffffffffff058);
            piVar8 = bitmap::BitmapArray<long>::iterator::operator++(&local_50);
            bVar2 = bitmap::BitmapArray<long>::iterator::operator<
                              (piVar8,(iterator *)&stack0x00000028);
            bVar1 = false;
            if (bVar2) {
              bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x126171);
              lVar7 = bitmap::BitmapArray::value_reference::operator_cast_to_long
                                ((value_reference *)0x12618e);
              bVar1 = -1 < lVar7;
            }
          } while (bVar1);
          bVar1 = bitmap::BitmapArray<long>::iterator::operator<=
                            ((iterator *)in_stack_fffffffffffff060,&in_stack_fffffffffffff058->m_a);
          if (bVar1) break;
        }
        bitmap::BitmapArray<long>::iterator::operator=(&local_60,&local_50);
        do {
          bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x1261ed);
          bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x12620a);
          bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x126220);
          bitmap::BitmapArray<long>::value_reference::operator=
                    (in_stack_fffffffffffff060,(long)in_stack_fffffffffffff058);
          bitmap::BitmapArray<long>::iterator::operator++(&local_50);
          bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x126257);
          lVar7 = bitmap::BitmapArray::value_reference::operator_cast_to_long
                            ((value_reference *)0x126274);
        } while (lVar7 < 0);
        local_a8 = bitmap::BitmapArray<long>::iterator::operator-
                             (&local_50,(iterator *)&stack0x00000008);
        do {
          bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x1262b5);
          bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x1262d2);
          bitmap::BitmapArray<long>::iterator::operator[]
                    (in_stack_fffffffffffff070,(difference_type)in_stack_fffffffffffff068);
          bitmap::BitmapArray<long>::value_reference::operator=
                    (in_stack_fffffffffffff060,(long)in_stack_fffffffffffff058);
          bitmap::BitmapArray<long>::iterator::operator++(&local_60);
          bVar1 = bitmap::BitmapArray<long>::iterator::operator<=
                            ((iterator *)in_stack_fffffffffffff060,&in_stack_fffffffffffff058->m_a);
        } while (bVar1);
        bitmap::BitmapArray<long>::iterator::operator++(&local_50);
      }
    }
    std::
    stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
    ::pop((stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
           *)0x12634e);
  } while( true );
}

Assistant:

void introsort(stack_type &stack, ISAIterator_type ISA, ISAIterator_type ISAd,
               const SAIterator_type SA, SAIterator_type first,
               SAIterator_type last, pos_type &budget, int &chance,
               pos_type size) {
  typedef typename std::iterator_traits<ISAIterator_type>::value_type value_type;
  typedef typename stack_type::value_type stackinfo_type;
#define UPDATE_BUDGET(n)\
  {\
    budget -= (n);\
    if(budget <= 0) {\
      budget += size;\
      if(--chance == 0) { break; }\
    }\
  }

  SAIterator_type a, b, c, d, e;
  pos_type s, t;
  value_type v, x;
  int limit, next;

  for (limit = helper::lg(last - first);;) {

    if (limit < 0) {
      if (limit == -1) {
        /* tandem repeat partition */
        helper::partition(ISAd - 1, first, first, last, a, b, last - SA - 1);

        /* update ranks */
        if (a < last) {
          for (c = first, v = a - SA - 1; c < a; ++c) {
            ISA[*c] = v;
          }
        }
        if (b < last) {
          for (c = a, v = b - SA - 1; c < b; ++c) {
            ISA[*c] = v;
          }
        }

        /* push */
        STACK_PUSH4(ISAd, a, b, 0);
        STACK_PUSH4(ISAd - 1, first, last, -2);
        if ((a - first) <= (last - b)) {
          if (first < a) {
            STACK_PUSH4(ISAd, b, last, helper::lg(last - b));
            last = a;
          } else {
            first = b;
          }
        } else {
          if (b < last) {
            STACK_PUSH4(ISAd, first, a, helper::lg(a - first));
            first = b;
          } else {
            last = a;
          }
        }
        limit = helper::lg(last - first);
      } else if (limit == -2) {
        /* tandem repeat copy */
        stackinfo_type temp = stack.top();
        stack.pop();
        a = temp.m_b, b = temp.m_c;
        t = ISAd - ISA;
        v = b - SA - 1;
        for (c = first, d = a; c < d; ++c) {
          if ((0 <= (s = *c - t)) && (ISA[s] == v)) {
            ISA[s] = d - SA;
            *d++ = s;
          }
        }
        for (c = last - 1, e = d, d = b; e < d; --c) {
          if ((0 <= (s = *c - t)) && (ISA[s] == v)) {
            *--d = s;
            ISA[s] = d - SA;
          }
        }
        STACK_POP4(ISAd, first, last, limit);
      } else {
        /* sorted partition */
        if (0 <= *first) {
          a = first;
          do {
            ISA[*a] = a - SA;
          } while ((++a < last) && (0 <= *a));
          first = a;
        }
        if (first < last) {
          a = first;
          do {
            *a = ~*a;
          } while (*++a < 0);
          ++a;
          if (a < last) {
            for (c = first, v = a - SA - 1; c < a; ++c) {
              ISA[*c] = v;
            }
          }

          /* push */
          next = (ISA[*first] == ISAd[*first]) ? -1 : helper::lg(a - first);
          UPDATE_BUDGET(last - first);
          if ((a - first) <= (last - a)) {
            if (first < a) {
              STACK_PUSH4(ISAd, a, last, -3);
              ISAd += 1, last = a, limit = next;
            } else {
              first = a, limit = -3;
            }
          } else {
            if (a < last) {
              STACK_PUSH4(ISAd + 1, first, a, next);
              first = a, limit = -3;
            } else {
              ISAd += 1, last = a, limit = next;
            }
          }
        } else {
          STACK_POP4(ISAd, first, last, limit);
        }
      }
      continue;
    }

    if ((last - first) <= 8) {
      if (1 < (last - first)) {
        helper::insertionsort(ISAd, first, last);
        limit = -3;
      } else {
        STACK_POP4(ISAd, first, last, limit);
      }
      continue;
    }

    if (limit-- == 0) {
      helper::heapsort(ISAd, first, last - first);
      for (a = last - 1, v = ISAd[*a]; first < a;) {
        if ((x = ISAd[*--a]) == v) {
          *a = ~*a;
        } else {
          v = x;
        }
      }
      limit = -3;
      continue;
    }

    a = helper::pivot(ISAd, first, last);
    std::iter_swap(first, a);
    if (helper::partition(ISAd, first, first + 1, last, a, b, ISAd[*first])
        != false) {
      next = (ISA[*a] == ISAd[*a]) ? -1 : helper::lg(b - a);

      /* update ranks */
      for (c = first, v = a - SA - 1; c < a; ++c) {
        ISA[*c] = v;
      }
      if (b < last) {
        for (c = a, v = b - SA - 1; c < b; ++c) {
          ISA[*c] = v;
        }
      }

      /* push */
      UPDATE_BUDGET(last - first);
      if ((a - first) <= (last - b)) {
        if ((last - b) <= (b - a)) {
          STACK_PUSH4(ISAd + 1, a, b, next);
          STACK_PUSH4(ISAd, b, last, limit);
          last = a;
        } else if ((a - first) <= (b - a)) {
          STACK_PUSH4(ISAd, b, last, limit);
          STACK_PUSH4(ISAd + 1, a, b, next);
          last = a;
        } else {
          STACK_PUSH4(ISAd, b, last, limit);
          STACK_PUSH4(ISAd, first, a, limit);
          ISAd += 1, first = a, last = b, limit = next;
        }
      } else {
        if ((a - first) <= (b - a)) {
          STACK_PUSH4(ISAd + 1, a, b, next);
          STACK_PUSH4(ISAd, first, a, limit);
          first = b;
        } else if ((last - b) <= (b - a)) {
          STACK_PUSH4(ISAd, first, a, limit);
          STACK_PUSH4(ISAd + 1, a, b, next);
          first = b;
        } else {
          STACK_PUSH4(ISAd, first, a, limit);
          STACK_PUSH4(ISAd, b, last, limit);
          ISAd += 1, first = a, last = b, limit = next;
        }
      }
    } else {
      limit = (ISA[*first] == ISAd[*first]) ? -1 : (limit + 1), ISAd += 1;
      UPDATE_BUDGET(last - first);
    }
  }

  for (; stack.empty() == false; stack.pop()) {
    stackinfo_type temp = stack.top();
    if (temp.m_d == -3) {
      first = temp.m_b, last = temp.m_c;
      for (a = first; a < last; ++a) {
        if (0 <= *a) {
          b = a;
          do {
            ISA[*a] = a - SA;
          } while ((++a < last) && (0 <= *a));
          if (last <= a) {
            break;
          }
        }
        b = a;
        do {
          *a = ~*a;
        } while (*++a < 0);
        v = a - SA;
        do {
          ISA[*b] = v;
        } while (++b <= a);
      }
    }
  }
#undef UPDATE_BUDGET
}